

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

exr_result_t unpack_32bit(exr_decode_pipeline_t *decode)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long in_RDI;
  int64_t x;
  uint32_t *src;
  exr_coding_channel_info_t *decc_1;
  int c_1;
  int64_t y;
  exr_coding_channel_info_t *decc;
  int c;
  int chans;
  int64_t pixincrement;
  int64_t h;
  int64_t w;
  uint8_t *cdata;
  uint8_t *srcbuffer;
  long local_68;
  undefined4 *local_60;
  int local_4c;
  long local_48;
  int local_38;
  undefined4 *local_18;
  undefined4 *local_10;
  
  local_10 = *(undefined4 **)(in_RDI + 0x88);
  sVar1 = *(short *)(in_RDI + 0x10);
  iVar2 = *(int *)(in_RDI + 0x2c);
  iVar3 = *(int *)(in_RDI + 100);
  for (local_38 = 0; local_38 < *(short *)(in_RDI + 0x10); local_38 = local_38 + 1) {
    local_10 = (undefined4 *)
               ((long)local_10 +
               (long)(*(int *)(*(long *)(in_RDI + 8) + (long)local_38 * 0x30 + 0xc) *
                      *(int *)(in_RDI + 0x60) * 4));
  }
  iVar4 = *(int *)(in_RDI + 0x60);
  for (local_48 = 0; local_48 < ((long)iVar2 - (long)iVar3) - (long)iVar4; local_48 = local_48 + 1)
  {
    for (local_4c = 0; local_4c < sVar1; local_4c = local_4c + 1) {
      lVar6 = *(long *)(in_RDI + 8) + (long)local_4c * 0x30;
      lVar7 = (long)*(int *)(lVar6 + 0xc);
      iVar5 = *(int *)(lVar6 + 0x20);
      local_18 = (undefined4 *)(local_48 * *(int *)(lVar6 + 0x24) + *(long *)(lVar6 + 0x28));
      if ((long)iVar5 == 4) {
        memcpy(local_18,local_10,lVar7 << 2);
      }
      else {
        local_60 = local_10;
        for (local_68 = 0; local_68 < lVar7; local_68 = local_68 + 1) {
          *local_18 = *local_60;
          local_18 = (undefined4 *)((long)iVar5 + (long)local_18);
          local_60 = local_60 + 1;
        }
      }
      local_10 = local_10 + lVar7;
    }
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_32bit (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t* srcbuffer = decode->unpacked_buffer;
    uint8_t*       cdata;
    int64_t        w, h, pixincrement;
    int            chans = decode->channel_count;

    h = (int64_t) decode->chunk.height - decode->user_line_end_ignore;
    /*
     * if we have user_line_begin_skip, the user data pointer is at THAT
     * offset but our unpacked data is at y of '0' (well idx * height)
     */
    for (int c = 0; c < decode->channel_count; ++c)
    {
        exr_coding_channel_info_t* decc = (decode->channels + c);
        srcbuffer += decc->width * decode->user_line_begin_skip * 4;
    }
    h -= decode->user_line_begin_skip;

    for (int64_t y = 0; y < h; ++y)
    {
        for (int c = 0; c < chans; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata        = decc->decode_to_ptr;
            w            = decc->width;
            pixincrement = decc->user_pixel_stride;
            cdata += y * (int64_t) decc->user_line_stride;
            /* specialize to memcpy if we can */
#if EXR_HOST_IS_NOT_LITTLE_ENDIAN
            if (pixincrement == 4)
            {
                uint32_t*       tmp = (uint32_t*) cdata;
                const uint32_t* src = (const uint32_t*) srcbuffer;
                uint32_t*       end = tmp + w;

                while (tmp < end)
                    *tmp++ = le32toh (*src++);
            }
            else
            {
                const uint32_t* src = (const uint32_t*) srcbuffer;
                for (int64_t x = 0; x < w; ++x)
                {
                    *((uint32_t*) cdata) = le32toh (*src++);
                    cdata += pixincrement;
                }
            }
#else
            if (pixincrement == 4)
            {
                memcpy (cdata, srcbuffer, (size_t) (w) * 4);
            }
            else
            {
                const uint32_t* src = (const uint32_t*) srcbuffer;
                for (int64_t x = 0; x < w; ++x)
                {
                    *((uint32_t*) cdata) = *src++;
                    cdata += pixincrement;
                }
            }
#endif
            srcbuffer += w * 4;
        }
    }
    return EXR_ERR_SUCCESS;
}